

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::ReadNames<internal::NameHandler>
          (internal *this,CStringRef filename,StringRef data,NameHandler *handler)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  ReadError *this_00;
  int arg1;
  char *pcVar4;
  CStringRef CVar5;
  char *pcVar6;
  StringRef name;
  
  pcVar4 = data.data_;
  pcVar1 = filename.data_ + (long)pcVar4;
  pcVar6 = filename.data_ + 1;
  arg1 = 1;
  lVar2 = 0;
  CVar5.data_ = filename.data_;
  for (; pcVar4 != (char *)0x0; pcVar4 = pcVar4 + -1) {
    lVar3 = lVar2;
    if (pcVar6[-1] == '\r') {
      lVar3 = 1;
    }
    if (pcVar6[-1] == '\n') {
      name.size_ = (long)CVar5.data_ - (long)(filename.data_ + lVar2);
      name.data_ = filename.data_;
      ::internal::NameHandler::OnName((NameHandler *)data.size_,name);
      arg1 = arg1 + 1;
      lVar3 = 0;
      filename.data_ = pcVar6;
    }
    pcVar6 = pcVar6 + 1;
    CVar5.data_ = CVar5.data_ + 1;
    lVar2 = lVar3;
  }
  if (filename.data_ != pcVar1) {
    this_00 = (ReadError *)__cxa_allocate_exception(0x40);
    ReadError::ReadError<>
              (this_00,(CStringRef)this,arg1,((int)pcVar1 - (int)filename.data_) + 1,
               (CStringRef)0x142344);
    __cxa_throw(this_00,&ReadError::typeinfo,ReadError::~ReadError);
  }
  return;
}

Assistant:

void ReadNames(fmt::CStringRef filename, fmt::StringRef data,
               NameHandler &handler) {
  bool in_win_newline = false;
  int line = 1;
  const char *start = data.data();
  const char *end = start + data.size();
  for (const char *ptr = start; ptr != end; ++ptr) {
    if (*ptr == '\r') in_win_newline = true;
    if (*ptr == '\n') {
      handler.OnName(fmt::StringRef(start, ptr - start - in_win_newline));
      start = ptr + 1;
      ++line;
      in_win_newline = false;
    }
  }
  if (start != end) {
    int column = static_cast<int>(end - start + 1);
    throw ReadError(filename, line, column, "missing newline");
  }
}